

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall
wasm::FunctionValidator::validateAlignment
          (FunctionValidator *this,size_t align,Type type,Index bytes,bool isAtomic,Expression *curr
          )

{
  ValidationInfo *this_00;
  Expression *curr_00;
  bool bVar1;
  BasicType BVar2;
  Function *func;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  Expression *local_30;
  Expression *curr_local;
  bool isAtomic_local;
  size_t sStack_20;
  Index bytes_local;
  size_t align_local;
  FunctionValidator *this_local;
  Type type_local;
  
  local_30 = curr;
  curr_local._3_1_ = isAtomic;
  curr_local._4_4_ = bytes;
  sStack_20 = align;
  align_local = (size_t)this;
  this_local = (FunctionValidator *)type.id;
  if (isAtomic) {
    shouldBeEqual<wasm::Expression*,unsigned_long>
              (this,align,(ulong)bytes,curr,"atomic accesses must have natural alignment");
  }
  else {
    if ((((1 < align - 1) && (align != 4)) && (align != 8)) && (align != 0x10)) {
      this_00 = this->info;
      std::__cxx11::to_string(&local_70,align);
      std::operator+(&local_50,"bad alignment: ",&local_70);
      curr_00 = local_30;
      func = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
             getFunction(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                          ).
                          super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          .
                          super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        );
      ValidationInfo::fail<wasm::Expression*,std::__cxx11::string>(this_00,&local_50,curr_00,func);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    shouldBeTrue<wasm::Expression*>
              (this,sStack_20 <= curr_local._4_4_,local_30,"alignment must not exceed natural");
    bVar1 = wasm::Type::isTuple((Type *)&this_local);
    if (bVar1) {
      __assert_fail("!type.isTuple() && \"Unexpected tuple type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                    ,0xc3e,
                    "void wasm::FunctionValidator::validateAlignment(size_t, Type, Index, bool, Expression *)"
                   );
    }
    bVar1 = wasm::Type::isBasic((Type *)&this_local);
    if (!bVar1) {
      __assert_fail("type.isBasic() && \"TODO: handle compound types\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                    ,0xc3e,
                    "void wasm::FunctionValidator::validateAlignment(size_t, Type, Index, bool, Expression *)"
                   );
    }
    BVar2 = wasm::Type::getBasic((Type *)&this_local);
    switch(BVar2) {
    case none:
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                         ,0xc4e);
    case unreachable:
    case v128:
      break;
    case i32:
    case f32:
      shouldBeTrue<wasm::Expression*>
                (this,sStack_20 < 5,local_30,"alignment must not exceed natural");
      break;
    case i64:
    case f64:
      shouldBeTrue<wasm::Expression*>
                (this,sStack_20 < 9,local_30,"alignment must not exceed natural");
    }
  }
  return;
}

Assistant:

void FunctionValidator::validateAlignment(
  size_t align, Type type, Index bytes, bool isAtomic, Expression* curr) {
  if (isAtomic) {
    shouldBeEqual(align,
                  (size_t)bytes,
                  curr,
                  "atomic accesses must have natural alignment");
    return;
  }
  switch (align) {
    case 1:
    case 2:
    case 4:
    case 8:
    case 16:
      break;
    default: {
      info.fail("bad alignment: " + std::to_string(align), curr, getFunction());
      break;
    }
  }
  shouldBeTrue(align <= bytes, curr, "alignment must not exceed natural");
  TODO_SINGLE_COMPOUND(type);
  switch (type.getBasic()) {
    case Type::i32:
    case Type::f32: {
      shouldBeTrue(align <= 4, curr, "alignment must not exceed natural");
      break;
    }
    case Type::i64:
    case Type::f64: {
      shouldBeTrue(align <= 8, curr, "alignment must not exceed natural");
      break;
    }
    case Type::v128:
    case Type::unreachable:
      break;
    case Type::none:
      WASM_UNREACHABLE("invalid type");
  }
}